

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O3

bool __thiscall
ON_CompressedBuffer::Uncompress(ON_CompressedBuffer *this,void *outbuffer,int *bFailedCRC)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ON__UINT32 OVar4;
  endian eVar5;
  ON_CompressedBufferHelper *this_00;
  ON_CompressedBuffer *this_01;
  ON_CompressedBufferHelper helper;
  ON_CompressedBufferHelper local_4098;
  
  this_00 = &local_4098;
  if (bFailedCRC != (int *)0x0) {
    *bFailedCRC = 0;
  }
  bVar2 = true;
  if (this->m_sizeof_uncompressed != 0) {
    if ((outbuffer != (void *)0x0) && ((uint)this->m_method < 2)) {
      OVar4 = ON_CRC32(0,this->m_sizeof_compressed,this->m_buffer_compressed);
      if ((OVar4 != this->m_crc_compressed) &&
         (memset(outbuffer,0,this->m_sizeof_uncompressed), bFailedCRC != (int *)0x0)) {
        *bFailedCRC = 0;
      }
      if (this->m_method == 1) {
        bVar3 = false;
        memset(&local_4098,0,0x4068);
        local_4098.m_action = 2;
        bVar2 = CompressionInit((ON_CompressedBuffer *)this_00,&local_4098);
        if (bVar2) {
          this_01 = this;
          bVar3 = InflateHelper(this,&local_4098,this->m_sizeof_uncompressed,outbuffer);
          CompressionEnd(this_01,&local_4098);
        }
      }
      else if (((this->m_method == 0) && (this->m_buffer_compressed != (void *)0x0)) &&
              (this->m_sizeof_uncompressed == this->m_sizeof_compressed)) {
        memcpy(outbuffer,this->m_buffer_compressed,this->m_sizeof_uncompressed);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      uVar1 = this->m_sizeof_element;
      if ((((ulong)uVar1 < 9) && ((0x114U >> (uVar1 & 0x1f) & 1) != 0)) &&
         ((this->m_sizeof_uncompressed % (ulong)uVar1 == 0 &&
          (eVar5 = ON::Endian(), eVar5 == big_endian)))) {
        ON_BinaryArchive::ToggleByteOrder
                  ((long)(int)(this->m_sizeof_uncompressed / (ulong)(long)this->m_sizeof_element),
                   (long)this->m_sizeof_element,outbuffer,outbuffer);
      }
      if (bVar3 != false) {
        OVar4 = ON_CRC32(0,this->m_sizeof_uncompressed,outbuffer);
        if (OVar4 == this->m_crc_uncompressed) {
          return true;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_zlib.cpp"
                   ,0x420,"","ON_CompressedBuffer::Uncompress() crc error");
        if (bFailedCRC == (int *)0x0) {
          return true;
        }
        *bFailedCRC = 1;
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_CompressedBuffer::Uncompress(
          void* outbuffer,
          int* bFailedCRC
          ) const
{
  bool rc = false;

  if ( bFailedCRC)
    *bFailedCRC = false;
  if ( 0 == m_sizeof_uncompressed )
    return true;
  if ( 0 == outbuffer )
    return false;

  if ( m_method != 0 && m_method != 1 )
    return false;

  ON__UINT32 compressed_crc = ON_CRC32( 0, m_sizeof_compressed, m_buffer_compressed );
  if ( compressed_crc != m_crc_compressed )
  {
    // m_buffer_compressed is corrupt - let's hope the corruption
    // is near the end and we ge something useful from the
    // beginning.
    memset(outbuffer,0,m_sizeof_uncompressed);
    if ( bFailedCRC)
      *bFailedCRC = false;
  }

  switch(m_method)
  {
  case 0: // uncompressed
    if (    m_buffer_compressed
         && m_sizeof_uncompressed == m_sizeof_compressed
         )
    {
      memcpy(outbuffer,m_buffer_compressed,m_sizeof_uncompressed);
      rc = true;
    }
    break;

  case 1: // compressed
    {
      ON_CompressedBufferHelper helper;
      memset(&helper,0,sizeof(helper));
      helper.m_action = 2;
      rc = CompressionInit(&helper);
      if (rc)
      {
        rc = InflateHelper( &helper, m_sizeof_uncompressed, outbuffer );
        CompressionEnd(&helper);
      }
    }
    break;
  }

  switch(m_sizeof_element)
  {
  case 2:
  case 4:
  case 8:
    if ( 0 == (m_sizeof_uncompressed%m_sizeof_element) )
    {
      if (ON::endian::big_endian == ON::Endian())
      {
        ON_BinaryFile::ToggleByteOrder( 
          (int)(m_sizeof_uncompressed/m_sizeof_element), 
          m_sizeof_element, 
          outbuffer, 
          outbuffer
          );
      }
    }
    break;
  };


  if (rc ) 
  {
    ON__UINT32 uncompressed_crc = ON_CRC32( 0, m_sizeof_uncompressed, outbuffer );
    if ( uncompressed_crc != m_crc_uncompressed ) 
    {
      ON_ERROR("ON_CompressedBuffer::Uncompress() crc error");
      if ( bFailedCRC )
        *bFailedCRC = true;
    }
  }

  return rc;
}